

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O2

Bytes * __thiscall
SSM::ECUPort::buildReadRequest
          (Bytes *__return_storage_ptr__,ECUPort *this,Observables *observables,bool continuous)

{
  undefined8 *puVar1;
  ECUPort *this_00;
  long lVar2;
  long lVar3;
  undefined7 in_register_00000009;
  undefined8 *puVar4;
  long lVar5;
  ECUPort *this_01;
  long lVar6;
  initializer_list<std::byte> __l;
  allocator_type local_85;
  undefined4 local_84;
  ECUPort *local_80;
  Bytes addresses;
  _Vector_base<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_> local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  char cStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined2 uStack_42;
  long local_40;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,continuous);
  addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = *(undefined8 **)(observables + 8);
  local_80 = (ECUPort *)__return_storage_ptr__;
  for (puVar4 = *(undefined8 **)observables; this_00 = local_80, puVar4 != puVar1;
      puVar4 = puVar4 + 1) {
    (**(code **)(*(long *)*puVar4 + 0x10))(&local_48);
    lVar2 = local_40;
    lVar3 = CONCAT26(uStack_42,
                     CONCAT15(uStack_43,
                              CONCAT14(uStack_44,
                                       CONCAT13(cStack_45,
                                                CONCAT12(uStack_46,CONCAT11(uStack_47,local_48))))))
    ;
    while (lVar5 = lVar3, lVar5 != lVar2) {
      for (lVar6 = 0; lVar3 = lVar5 + 3, lVar6 != 3; lVar6 = lVar6 + 1) {
        std::vector<std::byte,_std::allocator<std::byte>_>::push_back
                  (&addresses,(value_type *)(lVar5 + lVar6));
      }
    }
    std::_Vector_base<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>::
    ~_Vector_base(&local_48);
  }
  local_48 = (_Vector_base<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>
             )0x80;
  uStack_47 = 0x10;
  uStack_46 = 0xf0;
  cStack_45 = ((char)addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (char)addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start) + '\x02';
  uStack_44 = 0xa8;
  uStack_43 = (undefined1)local_84;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_48;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_80,__l,&local_85);
  this_01 = this_00;
  std::vector<std::byte,std::allocator<std::byte>>::
  insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>,void>
            ((vector<std::byte,std::allocator<std::byte>> *)this_00,
             (const_iterator)
             (this_00->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>)
             addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>)
             addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_48 = (_Vector_base<std::array<std::byte,_3UL>,_std::allocator<std::array<std::byte,_3UL>_>_>
             )checksum(this_01,(Bytes *)this_00);
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
            ((vector<std::byte,_std::allocator<std::byte>_> *)this_00,(byte *)&local_48);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&addresses.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  return (Bytes *)this_00;
}

Assistant:

Bytes ECUPort::buildReadRequest(const Observables& observables,
				  bool continuous) const
  {
    // Add all read addresses to a byte vector
    Bytes addresses;
    for(const auto& obs : observables)
      for(const auto& addr: obs->addresses())
	for(const auto& addr_byte: addr)
	  addresses.push_back(addr_byte);
    
    // Build the header of read request. Datasize is number of
    // addresses plus 2 since READ and CONTIN_RESP/SINGLE_RESP bytes
    // are to be included (not the checksum byte though)
    Bytes request = { HEADER, ECU, TOOL, Byte(addresses.size()+2), READ,
		      (continuous ? CONTIN_RESP : SINGLE_RESP) };
    
    // Attach the addresses to read
    request.insert(request.end(), addresses.begin(), addresses.end());

    // Add the checksum byte and return
    request.push_back(checksum(request));
    return request;
  }